

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool ON_SubDEdgeChain::ContinueChainDefaultCallback
               (ON__UINT_PTR continue_condition,ON_SubDEdgePtr left_eptr,ON_SubDEdgePtr right_eptr)

{
  float fVar1;
  ON_SubDVertexTag OVar2;
  ON_SubDVertex *pOVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ON_SubDEdge *this;
  ON_SubDEdge *this_00;
  ON_SubDEdgeSharpness OVar11;
  float local_40 [2];
  float local_38 [2];
  
  this_00 = (ON_SubDEdge *)(left_eptr.m_ptr & 0xfffffffffffffff8);
  if (this_00 != (ON_SubDEdge *)0x0) {
    uVar6 = (ulong)((uint)left_eptr.m_ptr & 1);
    if (this_00->m_vertex[uVar6] == (ON_SubDVertex *)0x0) {
      return false;
    }
    uVar9 = uVar6 ^ 1;
    pOVar3 = this_00->m_vertex[uVar9];
    if (pOVar3 == (ON_SubDVertex *)0x0) {
      return false;
    }
    if (this_00->m_vertex[uVar6] == pOVar3) {
      return false;
    }
    this = (ON_SubDEdge *)(right_eptr.m_ptr & 0xfffffffffffffff8);
    if (this_00 != this && this != (ON_SubDEdge *)0x0) {
      uVar7 = (uint)right_eptr.m_ptr & 1;
      if (pOVar3 != this->m_vertex[uVar7]) {
        return false;
      }
      if (this->m_vertex[uVar7 ^ 1] == (ON_SubDVertex *)0x0) {
        return false;
      }
      if (this->m_vertex[uVar7] == this->m_vertex[uVar7 ^ 1]) {
        return false;
      }
      if (continue_condition == 0) {
        return true;
      }
      if (((continue_condition & 1) == 0) || (this_00->m_face_count == this->m_face_count)) {
        if ((continue_condition & 4) != 0) {
          bVar4 = ON_SubDEdge::IsSharp(this_00);
          bVar5 = ON_SubDEdge::IsSharp(this);
          if (bVar4 != bVar5) {
            return false;
          }
        }
        if ((continue_condition & 8) != 0) {
          OVar11 = ON_SubDEdge::Sharpness(this_00,true);
          local_38[0] = OVar11.m_edge_sharpness[0];
          local_38[1] = OVar11.m_edge_sharpness[1];
          fVar1 = local_38[uVar9];
          OVar11 = ON_SubDEdge::Sharpness(this,true);
          local_40[0] = OVar11.m_edge_sharpness[0];
          local_40[1] = OVar11.m_edge_sharpness[1];
          if (fVar1 != local_40[(uint)right_eptr.m_ptr & 1]) {
            return false;
          }
          if (NAN(fVar1) || NAN(local_40[(uint)right_eptr.m_ptr & 1])) {
            return false;
          }
        }
        if ((continue_condition & 0xf0) != 0) {
          OVar2 = pOVar3->m_vertex_tag;
          bVar4 = (bool)(OVar2 == Smooth & (byte)((continue_condition & 0xffffffff) >> 4) & 0xf);
          if (bVar4 == false) {
            bVar4 = (bool)(OVar2 == Crease & (byte)((continue_condition & 0xffffffff) >> 5) & 7);
          }
          if (bVar4 == false) {
            bVar4 = (bool)(OVar2 == Dart & (byte)((continue_condition & 0xffffffff) >> 6) & 3);
          }
          if (bVar4 == false) {
            bVar4 = OVar2 == Corner && (char)continue_condition < '\0';
          }
          if (bVar4 == false) {
            return false;
          }
        }
        if (((uint)continue_condition >> 8 & 1) == 0) {
          return true;
        }
        if (pOVar3->m_edge_count != 4) {
          return true;
        }
        if (pOVar3->m_face_count != 4) {
          return true;
        }
        uVar9 = this_00->m_face2[0].m_ptr & 0xfffffffffffffff8;
        uVar6 = this_00->m_face2[1].m_ptr & 0xfffffffffffffff8;
        if (uVar6 != 0 && uVar9 != 0) {
          uVar10 = this->m_face2[0].m_ptr & 0xfffffffffffffff8;
          uVar8 = this->m_face2[1].m_ptr & 0xfffffffffffffff8;
          if (uVar8 != 0 && uVar10 != 0) {
            return (uVar6 != uVar8 && uVar6 != uVar10) && (uVar9 != uVar8 && uVar9 != uVar10);
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdgeChain::ContinueChainDefaultCallback(
  ON__UINT_PTR continue_condition,
  ON_SubDEdgePtr left_eptr,
  ON_SubDEdgePtr right_eptr
)
{
  // Perform edge chain topology check
  const ON_SubDEdge* e0 = ON_SUBD_EDGE_POINTER(left_eptr.m_ptr);
  if (nullptr == e0)
    return false;
  const unsigned e0dir = (unsigned)(left_eptr.m_ptr & 1U);
  const ON_SubDVertex* v0[2] = { e0->m_vertex[e0dir], e0->m_vertex[1-e0dir] } ;
  if (nullptr == v0[0] || nullptr == v0[1])
    return false;
  if (v0[0] == v0[1])
    return false;
  const ON_SubDEdge* e1 = ON_SUBD_EDGE_POINTER(right_eptr.m_ptr);
  if (nullptr == e1)
    return false;
  // edges must be distinct
  if (e0 == e1)
    return false;
  // edges must have a common middle vertex
  const unsigned e1dir = (unsigned)(right_eptr.m_ptr & 1);
  const ON_SubDVertex* v1[2] = { e1->m_vertex[e1dir], e1->m_vertex[1 - e1dir] };
  if (v0[1] != v1[0])
    return false;
  if (nullptr == v1[1])
    return false;
  if (v1[0] == v1[1])
    return false;

  // edge chain topology check passed.
  if (0 == continue_condition)
    return true;

  if (0 != (continue_condition & 1))
  {
    // same face count check
    if (e0->m_face_count != e1->m_face_count)
      return false;
  }

  if (0 != (continue_condition & 4))
  {
    // same smooth / crease property
    if (e0->IsSharp() != e1->IsSharp())
      return false;
  }

  if (0 != (continue_condition & 8))
  {
    // equal sharpness at the common vertex check
    if ( false == (e0->Sharpness(true).EndSharpness(1-e0dir) == e1->Sharpness(true).EndSharpness(e1dir)))
      return false;
  }

  while (0 != (continue_condition & (16+32+64+128)))
  {
    // vertex tag filter
    const ON_SubDVertexTag vtag = v0[1]->m_vertex_tag;
    bool bPass = (0 != (continue_condition & 16) && ON_SubDVertexTag::Smooth == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 32) && ON_SubDVertexTag::Crease == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 64) && ON_SubDVertexTag::Dart == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 128) && ON_SubDVertexTag::Corner == vtag);

    if (false == bPass)
      return false;

    break;
  }

  if (0 != (continue_condition & 256) && 4 == v0[1]->m_edge_count && 4 == v0[1]->m_face_count)
  {
    // opposite interior crease check
    const ON_SubDFace* f0[2] = { ON_SUBD_FACE_POINTER(e0->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(e0->m_face2[1].m_ptr) };
    if (nullptr == f0[0] || nullptr == f0[1])
      return false;
    const ON_SubDFace* f1[2] = { ON_SUBD_FACE_POINTER(e1->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(e1->m_face2[1].m_ptr) };
    if (nullptr == f1[0] || nullptr == f1[1])
      return false;
    if (f0[0] == f1[0] || f0[0] == f1[1] || f0[1] == f1[0] || f0[1] == f1[1])
      return false; // the edges share a face
  }

  // All checks passed
  return true;
}